

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProtocolMACEthernet.cpp
# Opt level: O0

void __thiscall
ProtocolMACEthernet::ProtocolMACEthernet
          (ProtocolMACEthernet *this,ProtocolARP *arp,ProtocolIPv4 *ipv4)

{
  DataBuffer *local_60;
  DataBuffer *local_48;
  int local_30;
  int i;
  ProtocolIPv4 *ipv4_local;
  ProtocolARP *arp_local;
  ProtocolMACEthernet *this_local;
  
  InterfaceMAC::InterfaceMAC(&this->super_InterfaceMAC);
  (this->super_InterfaceMAC)._vptr_InterfaceMAC = (_func_int **)&PTR__ProtocolMACEthernet_00115cb8;
  osQueue::osQueue(&this->TxBufferQueue,"Tx",0x14,this->TxBufferBuffer);
  osQueue::osQueue(&this->RxBufferQueue,"Rx",0x14,this->RxBufferBuffer);
  osEvent::osEvent(&this->QueueEmptyEvent,"MACEthernet");
  local_48 = (DataBuffer *)&this->field_0x1a0;
  do {
    DataBuffer::DataBuffer(local_48);
    local_48 = local_48 + 1;
  } while (local_48 != (DataBuffer *)&this->field_0x2c20);
  local_60 = (DataBuffer *)&this->field_0x2c20;
  do {
    DataBuffer::DataBuffer(local_60);
    local_60 = local_60 + 1;
  } while (local_60 != (DataBuffer *)this->TxBufferBuffer);
  this->TxHandler = (DataTransmitHandler)0x0;
  this->ARP = arp;
  this->IPv4 = ipv4;
  this->BroadcastAddress[0] = 0xff;
  this->BroadcastAddress[1] = 0xff;
  this->BroadcastAddress[2] = 0xff;
  this->BroadcastAddress[3] = 0xff;
  this->BroadcastAddress[4] = 0xff;
  this->BroadcastAddress[5] = 0xff;
  for (local_30 = 0; local_30 < 0x14; local_30 = local_30 + 1) {
    osQueue::Put(&this->TxBufferQueue,this->BroadcastAddress + (long)local_30 * 0x220 + 10);
  }
  for (local_30 = 0; local_30 < 0x14; local_30 = local_30 + 1) {
    osQueue::Put(&this->RxBufferQueue,&this->field_0x2c20 + (long)local_30 * 0x220);
  }
  return;
}

Assistant:

ProtocolMACEthernet::ProtocolMACEthernet(ProtocolARP& arp, ProtocolIPv4& ipv4)
    : TxBufferQueue("Tx", TX_BUFFER_COUNT, TxBufferBuffer)
    , RxBufferQueue("Rx", RX_BUFFER_COUNT, RxBufferBuffer)
    , QueueEmptyEvent("MACEthernet")
    , TxHandler(nullptr)
    , ARP(arp)
    , IPv4(ipv4)
{
    int i;

    BroadcastAddress[0] = 0xFF;
    BroadcastAddress[1] = 0xFF;
    BroadcastAddress[2] = 0xFF;
    BroadcastAddress[3] = 0xFF;
    BroadcastAddress[4] = 0xFF;
    BroadcastAddress[5] = 0xFF;

    for (i = 0; i < TX_BUFFER_COUNT; i++)
    {
        TxBufferQueue.Put(&TxBuffer[i]);
    }
    for (i = 0; i < RX_BUFFER_COUNT; i++)
    {
        RxBufferQueue.Put(&RxBuffer[i]);
    }
}